

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple.cpp
# Opt level: O1

int ReturnTest(void)

{
  return 0;
}

Assistant:

int ReturnTest()
{
    IUTEST_ASSERT_TRUE(true) << ::iutest::AssertionReturn(-1);
    return 0;
}